

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

VarValue *
deqp::gles3::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  bool bVar1;
  int iVar2;
  DataType dataType;
  DataType DVar3;
  int iVar4;
  float fVar5;
  int local_40;
  int i_4;
  int texResultNumDims;
  DataType texResultScalarType;
  DataType texResultType;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int numElems;
  int samplerUnit_local;
  Random *rnd_local;
  DataType type_local;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  bVar1 = glu::isDataTypeFloatOrVec(type);
  if ((bVar1) || (bVar1 = glu::isDataTypeMatrix(type), bVar1)) {
    for (i_2 = 0; i_2 < iVar2; i_2 = i_2 + 1) {
      fVar5 = de::Random::getFloat(rnd,-10.0,10.0);
      *(float *)((long)&__return_storage_ptr__->val + (long)i_2 * 4) = fVar5;
    }
  }
  else {
    bVar1 = glu::isDataTypeIntOrIVec(type);
    if (bVar1) {
      for (i_3 = 0; i_3 < iVar2; i_3 = i_3 + 1) {
        iVar4 = de::Random::getInt(rnd,-10,10);
        *(int *)((long)&__return_storage_ptr__->val + (long)i_3 * 4) = iVar4;
      }
    }
    else {
      bVar1 = glu::isDataTypeUintOrUVec(type);
      if (bVar1) {
        for (texResultType = TYPE_INVALID; (int)texResultType < iVar2;
            texResultType = texResultType + TYPE_FLOAT) {
          iVar4 = de::Random::getInt(rnd,0,10);
          *(int *)((long)&__return_storage_ptr__->val + (long)(int)texResultType * 4) = iVar4;
        }
      }
      else {
        bVar1 = glu::isDataTypeBoolOrBVec(type);
        if (bVar1) {
          for (texResultScalarType = TYPE_INVALID; (int)texResultScalarType < iVar2;
              texResultScalarType = texResultScalarType + TYPE_FLOAT) {
            bVar1 = de::Random::getBool(rnd);
            (__return_storage_ptr__->val).boolV[(int)texResultScalarType] = bVar1;
          }
        }
        else {
          bVar1 = glu::isDataTypeSampler(type);
          if (bVar1) {
            dataType = getSamplerLookupReturnType(type);
            DVar3 = glu::getDataTypeScalarType(dataType);
            iVar2 = glu::getDataTypeScalarSize(dataType);
            (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
            for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
              if (DVar3 == TYPE_FLOAT) {
                fVar5 = de::Random::getFloat(rnd,0.0,1.0);
                *(float *)((long)&__return_storage_ptr__->val + (long)local_40 * 4 + 4) = fVar5;
              }
              else if (DVar3 == TYPE_INT) {
                iVar4 = de::Random::getInt(rnd,-10,10);
                *(int *)((long)&__return_storage_ptr__->val + (long)local_40 * 4 + 4) = iVar4;
              }
              else if (DVar3 == TYPE_UINT) {
                iVar4 = de::Random::getInt(rnd,0,10);
                *(int *)((long)&__return_storage_ptr__->val + (long)local_40 * 4 + 4) = iVar4;
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeUintOrUVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.uintV[i] = (deUint32)rnd.getInt(0, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		const glu::DataType		texResultType		= getSamplerLookupReturnType(type);
		const glu::DataType		texResultScalarType	= glu::getDataTypeScalarType(texResultType);
		const int				texResultNumDims	= glu::getDataTypeScalarSize(texResultType);

		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < texResultNumDims; i++)
		{
			switch (texResultScalarType)
			{
				case glu::TYPE_FLOAT:	result.val.samplerV.fillColor.floatV[i]		= rnd.getFloat(0.0f, 1.0f);		break;
				case glu::TYPE_INT:		result.val.samplerV.fillColor.intV[i]		= rnd.getInt(-10, 10);			break;
				case glu::TYPE_UINT:	result.val.samplerV.fillColor.uintV[i]		= (deUint32)rnd.getInt(0, 10);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
	else
		DE_ASSERT(false);

	return result;
}